

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_compile_regexp(JSContext *ctx,JSValue pattern,JSValue flags)

{
  JSValue val1;
  int iVar1;
  char *pcVar2;
  uint8_t *puVar3;
  JSValueUnion in_RCX;
  JSContext *in_RDI;
  int64_t in_R8;
  JSValue JVar4;
  char error_msg [64];
  JSValue ret;
  void *in_stack_00000080;
  int re_bytecode_len;
  size_t len;
  size_t i;
  uint8_t *re_bytecode_buf;
  int mask;
  int re_flags;
  char *str;
  size_t *in_stack_ffffffffffffff18;
  JSContext *ptr;
  JSContext *in_stack_ffffffffffffff20;
  JSValue in_stack_ffffffffffffff28;
  int64_t iVar5;
  undefined1 local_b8 [68];
  BOOL cesu8;
  size_t *in_stack_ffffffffffffff90;
  JSContext *in_stack_ffffffffffffff98;
  JSValueUnion in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  uint local_48;
  uint local_44;
  long lVar8;
  undefined1 in_stack_fffffffffffffff0 [16];
  JSValue JVar6;
  JSValue JVar7;
  
  lVar8 = in_stack_fffffffffffffff0._4_8_;
  cesu8 = (BOOL)((ulong)stack0xffffffffffffff88 >> 0x20);
  local_44 = 0;
  JVar4.tag = in_R8;
  JVar4.u.float64 = in_RCX.float64;
  iVar1 = JS_IsUndefined(JVar4);
  if (iVar1 == 0) {
    pcVar2 = JS_ToCStringLen(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                             in_stack_ffffffffffffff28);
    if (pcVar2 == (char *)0x0) {
      JVar6.u.ptr = (void *)(lVar8 << 0x20);
      JVar6.tag = 6;
      return JVar6;
    }
    in_stack_ffffffffffffffa8 = (void *)0x0;
    while( true ) {
      if (in_stack_ffffffffffffffa0.ptr <= in_stack_ffffffffffffffa8) break;
      in_stack_ffffffffffffff20 =
           (JSContext *)(ulong)((byte)pcVar2[(long)in_stack_ffffffffffffffa8] - 0x67);
      switch(in_stack_ffffffffffffff20) {
      case (JSContext *)0x0:
        local_48 = 1;
        break;
      default:
        goto LAB_00146beb;
      case (JSContext *)0x2:
        local_48 = 2;
        break;
      case (JSContext *)0x6:
        local_48 = 4;
        break;
      case (JSContext *)0xc:
        local_48 = 8;
        break;
      case (JSContext *)0xe:
        local_48 = 0x10;
        break;
      case (JSContext *)0x12:
        local_48 = 0x20;
      }
      if ((local_44 & local_48) != 0) {
LAB_00146beb:
        JS_FreeCString((JSContext *)in_stack_ffffffffffffff28.tag,
                       (char *)in_stack_ffffffffffffff28.u.ptr);
        JVar4 = JS_ThrowSyntaxError(in_RDI,"invalid regular expression flags");
        return JVar4;
      }
      local_44 = local_48 | local_44;
      in_stack_ffffffffffffffa8 = (void *)((long)in_stack_ffffffffffffffa8 + 1);
    }
    JS_FreeCString((JSContext *)in_stack_ffffffffffffff28.tag,
                   (char *)in_stack_ffffffffffffff28.u.ptr);
  }
  val1.tag = (int64_t)in_stack_ffffffffffffffa8;
  val1.u.ptr = in_stack_ffffffffffffffa0.ptr;
  pcVar2 = JS_ToCStringLen2(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,val1,cesu8);
  if (pcVar2 == (char *)0x0) {
    JVar7.u.ptr = (void *)(lVar8 << 0x20);
    JVar7.tag = 6;
  }
  else {
    ptr = in_RDI;
    puVar3 = lre_compile((int *)error_msg._56_8_,(char *)error_msg._48_8_,error_msg._44_4_,
                         (char *)error_msg._32_8_,error_msg._24_8_,error_msg._20_4_,
                         in_stack_00000080);
    JS_FreeCString((JSContext *)in_stack_ffffffffffffff28.tag,
                   (char *)in_stack_ffffffffffffff28.u.ptr);
    if (puVar3 == (uint8_t *)0x0) {
      JS_ThrowSyntaxError(in_RDI,"%s",local_b8);
      JVar7.u.ptr = (void *)(lVar8 << 0x20);
      JVar7.tag = 6;
    }
    else {
      JVar4 = js_new_string8((JSContext *)in_stack_ffffffffffffff28.tag,
                             (uint8_t *)in_stack_ffffffffffffff28.u.ptr,
                             (int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      stack0xffffffffffffff28 = JVar4.u;
      iVar5 = JVar4.tag;
      js_free(in_stack_ffffffffffffff20,ptr);
      JVar7.tag = iVar5;
      JVar7.u.float64 = stack0xffffffffffffff88;
    }
  }
  return JVar7;
}

Assistant:

static JSValue js_compile_regexp(JSContext *ctx, JSValueConst pattern,
                                 JSValueConst flags)
{
    const char *str;
    int re_flags, mask;
    uint8_t *re_bytecode_buf;
    size_t i, len;
    int re_bytecode_len;
    JSValue ret;
    char error_msg[64];

    re_flags = 0;
    if (!JS_IsUndefined(flags)) {
        str = JS_ToCStringLen(ctx, &len, flags);
        if (!str)
            return JS_EXCEPTION;
        /* XXX: re_flags = LRE_FLAG_OCTAL unless strict mode? */
        for (i = 0; i < len; i++) {
            switch(str[i]) {
            case 'g':
                mask = LRE_FLAG_GLOBAL;
                break;
            case 'i':
                mask = LRE_FLAG_IGNORECASE;
                break;
            case 'm':
                mask = LRE_FLAG_MULTILINE;
                break;
            case 's':
                mask = LRE_FLAG_DOTALL;
                break;
            case 'u':
                mask = LRE_FLAG_UTF16;
                break;
            case 'y':
                mask = LRE_FLAG_STICKY;
                break;
            default:
                goto bad_flags;
            }
            if ((re_flags & mask) != 0) {
            bad_flags:
                JS_FreeCString(ctx, str);
                return JS_ThrowSyntaxError(ctx, "invalid regular expression flags");
            }
            re_flags |= mask;
        }
        JS_FreeCString(ctx, str);
    }

    str = JS_ToCStringLen2(ctx, &len, pattern, !(re_flags & LRE_FLAG_UTF16));
    if (!str)
        return JS_EXCEPTION;
    re_bytecode_buf = lre_compile(&re_bytecode_len, error_msg,
                                  sizeof(error_msg), str, len, re_flags, ctx);
    JS_FreeCString(ctx, str);
    if (!re_bytecode_buf) {
        JS_ThrowSyntaxError(ctx, "%s", error_msg);
        return JS_EXCEPTION;
    }

    ret = js_new_string8(ctx, re_bytecode_buf, re_bytecode_len);
    js_free(ctx, re_bytecode_buf);
    return ret;
}